

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O2

void __thiscall duckdb::MergeJoinLocalState::~MergeJoinLocalState(MergeJoinLocalState *this)

{
  ~MergeJoinLocalState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit MergeJoinLocalState(ClientContext &context, const PhysicalRangeJoin &op, const idx_t child)
	    : table(context, op, child) {
	}